

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

void __thiscall
dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::removeIncomingUses
          (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *this)

{
  while ((this->userEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
         super__Rb_tree_header._M_node_count != 0) {
    removeUseDependence(*(Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> **)
                         (*(_Base_ptr *)
                           ((long)&(this->userEdges).super_DGContainer<dg::LLVMNode_*,_4U>.container
                                   ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) + 1),
                        (LLVMNode *)this);
  }
  return;
}

Assistant:

void removeIncomingUses() {
        while (!userEdges.empty()) {
            NodeT *cd = *userEdges.begin();
            // this will remove the reverse control dependence from
            // this node
            cd->removeUseDependence(static_cast<NodeT *>(this));
        }
    }